

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O2

void cmListFileLexer_yyrestart(FILE *input_file,yyscan_t yyscanner)

{
  YY_BUFFER_STATE pyVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = *(long *)((long)yyscanner + 0x28);
  if ((lVar2 == 0) || (lVar3 = *(long *)((long)yyscanner + 0x18), *(long *)(lVar2 + lVar3 * 8) == 0)
     ) {
    cmListFileLexer_yyensure_buffer_stack(yyscanner);
    pyVar1 = cmListFileLexer_yy_create_buffer(*(FILE **)((long)yyscanner + 8),0x4000,yyscanner);
    lVar3 = *(long *)((long)yyscanner + 0x18);
    *(YY_BUFFER_STATE *)(*(long *)((long)yyscanner + 0x28) + lVar3 * 8) = pyVar1;
    lVar2 = *(long *)((long)yyscanner + 0x28);
    if (lVar2 == 0) {
      pyVar1 = (YY_BUFFER_STATE)0x0;
      goto LAB_002b5d12;
    }
  }
  pyVar1 = *(YY_BUFFER_STATE *)(lVar2 + lVar3 * 8);
LAB_002b5d12:
  cmListFileLexer_yy_init_buffer(pyVar1,input_file,yyscanner);
  cmListFileLexer_yy_load_buffer_state(yyscanner);
  return;
}

Assistant:

void yyrestart  (FILE * input_file , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack (yyscanner);
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE , yyscanner);
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file , yyscanner);
	yy_load_buffer_state( yyscanner );
}